

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pipelines.cpp
# Opt level: O1

void pipeline_2P_SP(size_t L,uint w)

{
  U *pUVar1;
  element_type *peVar2;
  int *piVar3;
  undefined8 *puVar4;
  _func_int **pp_Var5;
  Topology *pTVar6;
  _Head_base<0UL,_tf::Node_*,_false> _Var7;
  bool bVar8;
  pthread_mutex_t *__mutex;
  undefined8 uVar9;
  char cVar10;
  void *__s;
  long *plVar11;
  Node *pNVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var13;
  ulong uVar14;
  value_type_conflict3 *__val;
  pointer *__ptr;
  char cVar15;
  _func_int **pp_Var16;
  ulong uVar17;
  long lVar18;
  size_t sVar19;
  long in_FS_OFFSET;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  shared_ptr<tf::Topology> t;
  string __str;
  atomic<unsigned_long> j2;
  size_t j1;
  vector<int,_std::allocator<int>_> collection;
  size_t cnt;
  vector<int,_std::allocator<int>_> source;
  vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> mybuffer;
  Task test;
  Task pipeline;
  Taskflow taskflow;
  mutex mutex;
  Executor executor;
  future<void> local_538;
  undefined1 local_528 [24];
  undefined1 local_510 [18];
  undefined1 uStack_4fe;
  undefined1 uStack_4fd;
  undefined4 uStack_4fc;
  size_t local_4f0;
  __shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2> local_4e8;
  undefined1 local_4d8 [24];
  undefined8 local_4c0;
  undefined8 local_4b8;
  _Manager_type local_4b0;
  undefined1 local_4a8 [16];
  long local_498;
  pthread_mutex_t *local_488;
  long local_480;
  undefined1 local_478 [16];
  long local_468;
  ulong local_458;
  vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> local_450;
  size_type local_438;
  undefined1 (*local_430) [16];
  _Head_base<0UL,_tf::Node_*,_false> local_428;
  _Head_base<0UL,_tf::Node_*,_false> local_420;
  vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  local_418;
  undefined8 local_400;
  undefined4 local_3f8;
  _Manager_type local_3f0;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  undefined1 *local_3d8;
  vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *local_3d0;
  ulong local_3c8;
  int local_3c0;
  _Manager_type local_3b8;
  undefined1 *local_3b0;
  undefined8 *local_3a8;
  vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *local_3a0;
  ulong local_398;
  undefined8 local_390;
  undefined8 *local_388;
  undefined8 *puStack_380;
  undefined8 *local_378;
  vector<tf::Task,_std::allocator<tf::Task>_> local_370;
  vector<tf::Pipeflow,_std::allocator<tf::Pipeflow>_> local_358;
  undefined1 local_340 [16];
  undefined1 local_330 [16];
  undefined1 local_320 [16];
  undefined1 local_310 [16];
  undefined1 local_300 [16];
  undefined1 local_2f0 [32];
  float local_2d0;
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [32];
  float local_298;
  undefined1 local_290 [16];
  undefined8 local_280;
  __shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2> local_278;
  undefined1 local_260 [80];
  undefined1 local_210 [16];
  undefined1 local_200 [16];
  undefined1 local_1f0 [16];
  undefined1 local_1e0 [16];
  undefined1 local_1d0 [16];
  undefined1 local_1c0 [16];
  _Map_pointer local_1b0;
  bool local_1a0;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined8 local_178;
  Executor local_168;
  
  local_278._M_ptr = (element_type *)0x0;
  local_278._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&local_168,(ulong)w,(shared_ptr<tf::WorkerInterface> *)&local_278);
  if (local_278._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_278._M_refcount._M_pi);
  }
  local_478 = (undefined1  [16])0x0;
  local_468 = 0;
  local_4f0 = L;
  __s = operator_new(400);
  local_478._8_8_ = __s;
  local_478._0_8_ = __s;
  lVar18 = 0;
  local_468 = (long)__s + 400;
  memset(__s,0,400);
  sVar19 = local_4f0;
  local_478._8_8_ = (long)__s + 400;
  iVar20 = 0;
  iVar21 = 1;
  iVar22 = 2;
  iVar23 = 3;
  do {
    piVar3 = (int *)((long)__s + lVar18 * 4);
    *piVar3 = iVar20;
    piVar3[1] = iVar21;
    piVar3[2] = iVar22;
    piVar3[3] = iVar23;
    lVar18 = lVar18 + 4;
    iVar20 = iVar20 + 4;
    iVar21 = iVar21 + 4;
    iVar22 = iVar22 + 4;
    iVar23 = iVar23 + 4;
  } while (lVar18 != 100);
  std::vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>::vector
            (&local_450,local_4f0,(allocator_type *)&local_418);
  local_4b0 = (_Manager_type)0x0;
  local_430 = (undefined1 (*) [16])&local_388;
  local_458 = sVar19 << 4;
  local_438 = sVar19 + 1;
  local_488 = (pthread_mutex_t *)&local_168._topology_mutex;
  pTVar6 = (Topology *)(local_510 + 0x10);
  do {
    local_260._0_8_ = local_210;
    local_260._40_8_ = (__pthread_internal_list *)0x0;
    local_260._24_16_ = (undefined1  [16])0x0;
    local_260._8_16_ = (undefined1  [16])0x0;
    local_260._48_8_ = local_260 + 0x40;
    local_260._56_8_ = 0;
    local_260[0x40] = '\0';
    local_1b0 = (_Map_pointer)0x0;
    local_1c0 = (undefined1  [16])0x0;
    local_1d0 = (undefined1  [16])0x0;
    local_1e0 = (undefined1  [16])0x0;
    local_1f0 = (undefined1  [16])0x0;
    local_200 = (undefined1  [16])0x0;
    local_210 = (undefined1  [16])0x0;
    std::_Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>
    ::_M_initialize_map((_Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>
                         *)(local_200 + 8),0);
    uVar17 = local_458;
    local_1a0 = false;
    local_4b8 = 0;
    local_4c0._0_4_ = 0;
    local_4c0._4_4_ = 0;
    local_178 = 0;
    local_188 = (undefined1  [16])0x0;
    local_198 = (undefined1  [16])0x0;
    local_498 = 0;
    local_4a8 = (undefined1  [16])0x0;
    local_480 = 1;
    local_418.
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_418.
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_418.
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_3f8 = 1;
    local_3f0 = local_4b0;
    local_3e8 = local_4a8;
    local_3e0 = local_198;
    local_3d8 = local_4d8 + 0x18;
    local_3d0 = &local_450;
    local_3c0 = 2;
    local_3b8 = local_4b0;
    local_3b0 = local_478;
    local_3a8 = &local_4b8;
    local_390 = 0x100000002;
    local_3c8 = sVar19;
    local_3a0 = local_3d0;
    local_398 = sVar19;
    if (sVar19 >> 0x3b != 0) {
      std::__throw_length_error("cannot create std::vector larger than max_size()");
    }
    *local_430 = (undefined1  [16])0x0;
    *(undefined8 *)local_430[1] = 0;
    if (sVar19 == 0) {
      puStack_380 = (undefined8 *)0x0;
    }
    else {
      puStack_380 = (undefined8 *)operator_new(local_458);
    }
    puVar4 = (undefined8 *)((long)puStack_380 + uVar17);
    local_388 = puStack_380;
    local_378 = puVar4;
    if (local_4f0 != 0) {
      memset(puStack_380,0,uVar17);
      puStack_380 = puVar4;
    }
    std::vector<tf::Task,_std::allocator<tf::Task>_>::vector
              (&local_370,local_438,(allocator_type *)&local_538);
    sVar19 = local_4f0;
    std::vector<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>::vector
              (&local_358,local_4f0,(allocator_type *)&local_538);
    local_300 = (undefined1  [16])0x0;
    local_310 = (undefined1  [16])0x0;
    local_320 = (undefined1  [16])0x0;
    local_330 = (undefined1  [16])0x0;
    local_340 = (undefined1  [16])0x0;
    std::
    _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::_M_initialize_map((_Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                         *)local_340,0);
    local_2f0._0_8_ = local_2c8 + 8;
    local_2f0._8_8_ = 1;
    local_2f0._16_16_ = (undefined1  [16])0x0;
    local_2d0 = 1.0;
    local_2c8 = (undefined1  [16])0x0;
    local_2b8._0_8_ = local_290 + 8;
    local_2b8._8_8_ = 1;
    local_2b8._16_16_ = (undefined1  [16])0x0;
    local_298 = 1.0;
    local_290 = (undefined1  [16])0x0;
    local_280 = 0;
    if (sVar19 == 0) {
      tf::throw_re<char_const(&)[28]>
                ("/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/pipeline.hpp"
                 ,0x22e,(char (*) [28])"must have at least one line");
    }
    if (local_3c0 != 2) {
      tf::throw_re<char_const(&)[26]>
                ("/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/pipeline.hpp"
                 ,0x232,(char (*) [26])"first pipe must be serial");
    }
    local_400 = 0;
    if (local_358.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_358.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
        super__Vector_impl_data._M_start) {
      lVar18 = 0x28;
      uVar17 = 0;
      do {
        *(undefined8 *)
         ((long)local_358.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
                super__Vector_impl_data._M_start + lVar18 + -0x20) = 0;
        *(ulong *)((long)local_358.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar18 + -0x28) = uVar17;
        *(undefined8 *)
         ((long)local_358.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
                super__Vector_impl_data._M_start + lVar18 + -8) = 0;
        std::
        _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::clear((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)((long)&(local_358.
                            super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
                            super__Vector_impl_data._M_start)->_line + lVar18));
        uVar17 = uVar17 + 1;
        lVar18 = lVar18 + 0x60;
      } while (uVar17 < (ulong)(((long)local_358.
                                       super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_358.
                                       super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 5) *
                               -0x5555555555555555));
    }
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             *)local_2f0);
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_tf::DeferredPipeflow>,_std::allocator<std::pair<const_unsigned_long,_tf::DeferredPipeflow>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_tf::DeferredPipeflow>,_std::allocator<std::pair<const_unsigned_long,_tf::DeferredPipeflow>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             *)local_2b8);
    *local_388 = 0;
    if (1 < (ulong)(((long)local_358.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_358.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555)) {
      uVar17 = 1;
      lVar18 = 0x18;
      do {
        *(long *)((long)local_388 + lVar18) = (long)local_390._4_4_;
        uVar17 = uVar17 + 1;
        lVar18 = lVar18 + 0x10;
      } while (uVar17 < (ulong)(((long)local_358.
                                       super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_358.
                                       super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 5) *
                               -0x5555555555555555));
    }
    local_388[1] = 1;
    if (1 < (ulong)(((long)local_358.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_358.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555)) {
      uVar17 = 1;
      lVar18 = 0x10;
      do {
        *(long *)((long)local_388 + lVar18) = (long)(int)local_390 + -1;
        uVar17 = uVar17 + 1;
        lVar18 = lVar18 + 0x10;
      } while (uVar17 < (ulong)(((long)local_358.
                                       super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_358.
                                       super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 5) *
                               -0x5555555555555555));
    }
    local_538.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)operator_new(0xd8);
    ((Node *)local_538.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_nstate = 0;
    ((Node *)local_538.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_estate = (__atomic_base<int>)0x0;
    (((Node *)local_538.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_name)._M_dataplus._M_p =
         (pointer)&(((Node *)local_538.super___basic_future<void>._M_state.
                             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->_name).field_2;
    (((Node *)local_538.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_name)._M_string_length = 0;
    (((Node *)local_538.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_name).field_2._M_local_buf[0] = '\0';
    pUVar1 = &(((Node *)local_538.super___basic_future<void>._M_state.
                        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->_edges).super_SmallVectorImpl<tf::Node_*>.
              super_SmallVectorTemplateBase<tf::Node_*,_true>.
              super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl;
    ((Node *)local_538.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_data = (void *)0x0;
    ((Node *)local_538.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_topology = (Topology *)0x0;
    ((Node *)local_538.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_parent = (Node *)0x0;
    ((Node *)local_538.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_num_successors = 0;
    (((Node *)local_538.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_edges).super_SmallVectorImpl<tf::Node_*>.
    super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX = pUVar1;
    (((Node *)local_538.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_edges).super_SmallVectorImpl<tf::Node_*>.
    super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX = pUVar1;
    (((Node *)local_538.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_edges).super_SmallVectorImpl<tf::Node_*>.
    super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.CapacityX =
         &((Node *)local_538.super___basic_future<void>._M_state.
                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->_join_counter;
    *(undefined1 (*) [16])
     &((Node *)local_538.super___basic_future<void>._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->_join_counter = (undefined1  [16])0x0;
    *(undefined1 (*) [16])
     ((long)&(((Node *)local_538.super___basic_future<void>._M_state.
                       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->_handle).
             super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
     + 8) = (undefined1  [16])0x0;
    *(vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
      **)&(((Node *)local_538.super___basic_future<void>._M_state.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->_handle).
          super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          ._M_u = (vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                   *)&local_418;
    *(code **)((long)&(((Node *)local_538.super___basic_future<void>._M_state.
                                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->_handle).
                      super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              + 0x18) =
         std::
         _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/pipeline.hpp:805:26)>
         ::_M_invoke;
    *(code **)((long)&(((Node *)local_538.super___basic_future<void>._M_state.
                                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->_handle).
                      super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              + 0x10) =
         std::
         _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/pipeline.hpp:805:26)>
         ::_M_manager;
    *(__index_type *)
     ((long)&(((Node *)local_538.super___basic_future<void>._M_state.
                       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->_handle).
             super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
     + 0x38) = '\x04';
    ((Node *)local_538.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_semaphores =
         (__uniq_ptr_data<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>,_true,_true>
          )0x0;
    ((Node *)local_538.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_exception_ptr = (void *)0x0;
    std::
    vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
    ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
              ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                *)&local_418,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_538);
    if ((Node *)local_538.super___basic_future<void>._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr != (Node *)0x0) {
      std::default_delete<tf::Node>::operator()
                ((default_delete<tf::Node> *)&local_538,
                 (Node *)local_538.super___basic_future<void>._M_state.
                         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
    }
    pNVar12 = local_418.
              super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
              super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
              super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
              super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
    local_538.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x4;
    local_528._0_5_ = 0x646e6f63;
    local_538.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_528;
    std::__cxx11::string::_M_assign((string *)&pNVar12->_name);
    (local_370.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
     super__Vector_impl_data._M_start)->_node = pNVar12;
    if (local_538.super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)local_528) {
      operator_delete(local_538.super___basic_future<void>._M_state.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,local_528._0_8_ + 1);
    }
    if (local_358.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_358.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar17 = 0;
      do {
        local_538.super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)operator_new(0xd8);
        ((Node *)local_538.super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->_nstate = 0;
        ((Node *)local_538.super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->_estate = (__atomic_base<int>)0x0;
        (((Node *)local_538.super___basic_future<void>._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->_name)._M_dataplus._M_p =
             (pointer)&(((Node *)local_538.super___basic_future<void>._M_state.
                                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_name).field_2;
        (((Node *)local_538.super___basic_future<void>._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->_name)._M_string_length = 0;
        (((Node *)local_538.super___basic_future<void>._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->_name).field_2._M_local_buf[0] = '\0';
        pUVar1 = &(((Node *)local_538.super___basic_future<void>._M_state.
                            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->_edges).super_SmallVectorImpl<tf::Node_*>.
                  super_SmallVectorTemplateBase<tf::Node_*,_true>.
                  super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl;
        ((Node *)local_538.super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->_data = (void *)0x0;
        ((Node *)local_538.super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->_topology = (Topology *)0x0;
        ((Node *)local_538.super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->_parent = (Node *)0x0;
        ((Node *)local_538.super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->_num_successors = 0;
        (((Node *)local_538.super___basic_future<void>._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->_edges).super_SmallVectorImpl<tf::Node_*>.
        super_SmallVectorTemplateBase<tf::Node_*,_true>.
        super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX = pUVar1;
        (((Node *)local_538.super___basic_future<void>._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->_edges).super_SmallVectorImpl<tf::Node_*>.
        super_SmallVectorTemplateBase<tf::Node_*,_true>.
        super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX = pUVar1;
        (((Node *)local_538.super___basic_future<void>._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->_edges).super_SmallVectorImpl<tf::Node_*>.
        super_SmallVectorTemplateBase<tf::Node_*,_true>.
        super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.CapacityX =
             &((Node *)local_538.super___basic_future<void>._M_state.
                       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->_join_counter;
        (((Node *)local_538.super___basic_future<void>._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->_join_counter).super___atomic_base<unsigned_long>._M_i = 0;
        *(undefined1 (*) [16])
         ((long)&(((Node *)local_538.super___basic_future<void>._M_state.
                           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->_handle).
                 super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                 .
                 super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                 .
                 super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                 .
                 super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                 .
                 super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                 .
                 super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
         + 0x10) = (undefined1  [16])0x0;
        *(vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
          **)&(((Node *)local_538.super___basic_future<void>._M_state.
                        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->_handle).
              super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              .
              super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              .
              super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              .
              super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              .
              super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              .
              super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              ._M_u = (vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                       *)&local_418;
        *(ulong *)((long)&(((Node *)local_538.super___basic_future<void>._M_state.
                                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->_handle).
                          super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                          .
                          super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                          .
                          super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                          .
                          super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                          .
                          super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                          .
                          super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                  + 8) = uVar17;
        *(code **)((long)&(((Node *)local_538.super___basic_future<void>._M_state.
                                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->_handle).
                          super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                          .
                          super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                          .
                          super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                          .
                          super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                          .
                          super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                          .
                          super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                  + 0x18) =
             std::
             _Function_handler<void_(tf::Runtime_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/pipeline.hpp:812:32)>
             ::_M_invoke;
        *(code **)((long)&(((Node *)local_538.super___basic_future<void>._M_state.
                                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->_handle).
                          super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                          .
                          super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                          .
                          super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                          .
                          super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                          .
                          super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                          .
                          super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                  + 0x10) =
             std::
             _Function_handler<void_(tf::Runtime_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/pipeline.hpp:812:32)>
             ::_M_manager;
        *(__index_type *)
         ((long)&(((Node *)local_538.super___basic_future<void>._M_state.
                           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->_handle).
                 super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                 .
                 super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                 .
                 super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                 .
                 super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                 .
                 super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                 .
                 super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
         + 0x38) = '\x02';
        ((Node *)local_538.super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->_semaphores =
             (__uniq_ptr_data<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>,_true,_true>
              )0x0;
        ((Node *)local_538.super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->_exception_ptr = (void *)0x0;
        std::
        vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
        ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
                  ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                    *)&local_418,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_538)
        ;
        if ((Node *)local_538.super___basic_future<void>._M_state.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr != (Node *)0x0) {
          std::default_delete<tf::Node>::operator()
                    ((default_delete<tf::Node> *)&local_538,
                     (Node *)local_538.super___basic_future<void>._M_state.
                             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
        }
        pNVar12 = local_418.
                  super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                  super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
                  super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
                  super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
        uStack_4fe = 0x2d;
        local_510._16_2_ = 0x7472;
        local_510._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3;
        uStack_4fd = 0;
        cVar15 = '\x01';
        if (9 < uVar17) {
          uVar14 = uVar17;
          cVar10 = '\x04';
          do {
            cVar15 = cVar10;
            if (uVar14 < 100) {
              cVar15 = cVar15 + -2;
              goto LAB_0011e95a;
            }
            if (uVar14 < 1000) {
              cVar15 = cVar15 + -1;
              goto LAB_0011e95a;
            }
            if (uVar14 < 10000) goto LAB_0011e95a;
            bVar8 = 99999 < uVar14;
            uVar14 = uVar14 / 10000;
            cVar10 = cVar15 + '\x04';
          } while (bVar8);
          cVar15 = cVar15 + '\x01';
        }
LAB_0011e95a:
        local_4e8._M_ptr = (element_type *)local_4d8;
        local_510._0_8_ = pTVar6;
        std::__cxx11::string::_M_construct((ulong)&local_4e8,cVar15);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  ((char *)local_4e8._M_ptr,(uint)local_4e8._M_refcount._M_pi,uVar17);
        pp_Var16 = (_func_int **)0xf;
        if ((Topology *)local_510._0_8_ != pTVar6) {
          pp_Var16 = (_func_int **)
                     CONCAT44(uStack_4fc,CONCAT13(uStack_4fd,CONCAT12(uStack_4fe,local_510._16_2_)))
          ;
        }
        pp_Var5 = (_func_int **)
                  ((long)(_func_int ***)local_510._8_8_ +
                  (long)&(local_4e8._M_refcount._M_pi)->_vptr__Sp_counted_base);
        if (pp_Var16 < pp_Var5) {
          pp_Var16 = (_func_int **)0xf;
          if (local_4e8._M_ptr != (element_type *)local_4d8) {
            pp_Var16 = (_func_int **)local_4d8._0_8_;
          }
          if (pp_Var16 < pp_Var5) goto LAB_0011e9c5;
          plVar11 = (long *)std::__cxx11::string::replace
                                      ((ulong)&local_4e8,0,(char *)0x0,local_510._0_8_);
        }
        else {
LAB_0011e9c5:
          plVar11 = (long *)std::__cxx11::string::_M_append(local_510,(ulong)local_4e8._M_ptr);
        }
        local_538.super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_528;
        peVar2 = (element_type *)(plVar11 + 2);
        if ((element_type *)*plVar11 == peVar2) {
          local_528._0_8_ = peVar2->_vptr__State_baseV2;
          local_528._8_8_ = peVar2->_M_result;
        }
        else {
          local_528._0_8_ = peVar2->_vptr__State_baseV2;
          local_538.super___basic_future<void>._M_state.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)*plVar11;
        }
        local_538.super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar11[1];
        *plVar11 = (long)peVar2;
        plVar11[1] = 0;
        *(undefined1 *)&peVar2->_vptr__State_baseV2 = 0;
        std::__cxx11::string::_M_assign((string *)&pNVar12->_name);
        local_370.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
        super__Vector_impl_data._M_start[uVar17 + 1]._node = pNVar12;
        if (local_538.super___basic_future<void>._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            != (element_type *)local_528) {
          operator_delete(local_538.super___basic_future<void>._M_state.
                          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,local_528._0_8_ + 1);
        }
        if (local_4e8._M_ptr != (element_type *)local_4d8) {
          operator_delete(local_4e8._M_ptr,local_4d8._0_8_ + 1);
        }
        if ((Topology *)local_510._0_8_ != pTVar6) {
          operator_delete((void *)local_510._0_8_,
                          CONCAT44(uStack_4fc,
                                   CONCAT13(uStack_4fd,CONCAT12(uStack_4fe,local_510._16_2_))) + 1);
        }
        uVar17 = uVar17 + 1;
        tf::Task::precede<tf::Task&>
                  (local_370.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   local_370.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar17);
      } while (uVar17 < (ulong)(((long)local_358.
                                       super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_358.
                                       super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 5) *
                               -0x5555555555555555));
    }
    uVar9 = local_260._0_8_;
    local_538.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)operator_new(0xd8);
    ((Node *)local_538.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_nstate = 0;
    ((Node *)local_538.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_estate = (__atomic_base<int>)0x0;
    (((Node *)local_538.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_name)._M_dataplus._M_p =
         (pointer)&(((Node *)local_538.super___basic_future<void>._M_state.
                             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->_name).field_2;
    (((Node *)local_538.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_name)._M_string_length = 0;
    (((Node *)local_538.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_name).field_2._M_local_buf[0] = '\0';
    pUVar1 = &(((Node *)local_538.super___basic_future<void>._M_state.
                        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->_edges).super_SmallVectorImpl<tf::Node_*>.
              super_SmallVectorTemplateBase<tf::Node_*,_true>.
              super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl;
    ((Node *)local_538.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_data = (void *)0x0;
    ((Node *)local_538.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_topology = (Topology *)0x0;
    ((Node *)local_538.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_parent = (Node *)0x0;
    ((Node *)local_538.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_num_successors = 0;
    (((Node *)local_538.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_edges).super_SmallVectorImpl<tf::Node_*>.
    super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX = pUVar1;
    (((Node *)local_538.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_edges).super_SmallVectorImpl<tf::Node_*>.
    super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX = pUVar1;
    (((Node *)local_538.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_edges).super_SmallVectorImpl<tf::Node_*>.
    super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.CapacityX =
         &((Node *)local_538.super___basic_future<void>._M_state.
                   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->_join_counter;
    (((Node *)local_538.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_join_counter).super___atomic_base<unsigned_long>._M_i = 0;
    *(vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      **)&(((Node *)local_538.super___basic_future<void>._M_state.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->_handle).
          super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          .
          super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          ._M_u = &local_418;
    *(__index_type *)
     ((long)&(((Node *)local_538.super___basic_future<void>._M_state.
                       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->_handle).
             super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
     + 0x38) = '\x06';
    ((Node *)local_538.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_semaphores =
         (__uniq_ptr_data<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>,_true,_true>
          )0x0;
    ((Node *)local_538.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_exception_ptr = (void *)0x0;
    std::
    vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
    ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
              ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                *)uVar9,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_538);
    if ((Node *)local_538.super___basic_future<void>._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr != (Node *)0x0) {
      std::default_delete<tf::Node>::operator()
                ((default_delete<tf::Node> *)&local_538,
                 (Node *)local_538.super___basic_future<void>._M_state.
                         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
    }
    _Var7._M_head_impl =
         (((vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            *)uVar9)->
         super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
         super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
         super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
         super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
    local_538.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_528;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_538,"module_of_pipeline","");
    std::__cxx11::string::_M_assign((string *)&(_Var7._M_head_impl)->_name);
    local_420._M_head_impl = _Var7._M_head_impl;
    if (local_538.super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)local_528) {
      operator_delete(local_538.super___basic_future<void>._M_state.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,local_528._0_8_ + 1);
    }
    uVar9 = local_260._0_8_;
    pNVar12 = (Node *)operator_new(0xd8);
    pNVar12->_nstate = 0;
    pNVar12->_estate = (__atomic_base<int>)0x0;
    (pNVar12->_name)._M_dataplus._M_p = (pointer)&(pNVar12->_name).field_2;
    (pNVar12->_name)._M_string_length = 0;
    (pNVar12->_name).field_2._M_local_buf[0] = '\0';
    pUVar1 = &(pNVar12->_edges).super_SmallVectorImpl<tf::Node_*>.
              super_SmallVectorTemplateBase<tf::Node_*,_true>.
              super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl;
    pNVar12->_data = (void *)0x0;
    pNVar12->_topology = (Topology *)0x0;
    pNVar12->_parent = (Node *)0x0;
    pNVar12->_num_successors = 0;
    (pNVar12->_edges).super_SmallVectorImpl<tf::Node_*>.
    super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX = pUVar1;
    (pNVar12->_edges).super_SmallVectorImpl<tf::Node_*>.
    super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX = pUVar1;
    (pNVar12->_edges).super_SmallVectorImpl<tf::Node_*>.
    super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.CapacityX =
         &pNVar12->_join_counter;
    *(undefined1 (*) [16])&pNVar12->_join_counter = (undefined1  [16])0x0;
    *(undefined1 (*) [16])
     ((long)&(pNVar12->_handle).
             super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
     + 8) = (undefined1  [16])0x0;
    *(undefined8 *)
     ((long)&(pNVar12->_handle).
             super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
     + 0x18) = 0;
    plVar11 = (long *)operator_new(0x30);
    *plVar11 = (long)&local_4b8;
    plVar11[1] = (long)&local_4b0;
    plVar11[2] = (long)(local_4d8 + 0x18);
    plVar11[3] = (long)local_4a8;
    plVar11[4] = (long)&local_418;
    plVar11[5] = (long)&local_480;
    *(long **)&(pNVar12->_handle).
               super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               .
               super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               ._M_u = plVar11;
    *(code **)((long)&(pNVar12->_handle).
                      super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              + 0x18) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:344:34)>
         ::_M_invoke;
    *(code **)((long)&(pNVar12->_handle).
                      super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              + 0x10) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:344:34)>
         ::_M_manager;
    *(__index_type *)
     ((long)&(pNVar12->_handle).
             super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
     + 0x38) = '\x01';
    pNVar12->_semaphores =
         (__uniq_ptr_data<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>,_true,_true>
          )0x0;
    pNVar12->_exception_ptr = (void *)0x0;
    local_538.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)pNVar12;
    std::
    vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
    ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
              ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                *)uVar9,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_538);
    if ((Node *)local_538.super___basic_future<void>._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr != (Node *)0x0) {
      std::default_delete<tf::Node>::operator()
                ((default_delete<tf::Node> *)&local_538,
                 (Node *)local_538.super___basic_future<void>._M_state.
                         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
    }
    _Var7._M_head_impl =
         (((vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
            *)uVar9)->
         super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
         super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
         super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
         super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
    local_538.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_528;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_538,"test","");
    std::__cxx11::string::_M_assign((string *)&(_Var7._M_head_impl)->_name);
    local_428._M_head_impl = _Var7._M_head_impl;
    if (local_538.super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)local_528) {
      operator_delete(local_538.super___basic_future<void>._M_state.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,local_528._0_8_ + 1);
    }
    tf::Task::precede<tf::Task&>((Task *)&local_420,(Task *)&local_428);
    __mutex = local_488;
    iVar20 = pthread_mutex_lock(local_488);
    if (iVar20 != 0) {
      std::__throw_system_error(iVar20);
    }
    local_168._num_topologies = local_168._num_topologies + 1;
    pthread_mutex_unlock(__mutex);
    if (local_210._0_8_ == local_210._8_8_) {
      LOCK();
      local_4c0._0_4_ = 0;
      local_4c0._4_4_ = 0;
      UNLOCK();
      local_4b8 = 0;
      if (local_4a8._8_8_ != local_4a8._0_8_) {
        local_4a8._8_8_ = local_4a8._0_8_;
      }
      if ((long)local_450.
                super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_450.
                super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>.
                _M_impl.super__Vector_impl_data._M_start != 0) {
        lVar18 = (long)local_450.
                       super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_450.
                       super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3;
        memset(local_450.
               super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>.
               _M_impl.super__Vector_impl_data._M_start,0,(lVar18 + (ulong)(lVar18 == 0)) * 8);
      }
      local_480 = local_480 + 1;
      std::promise<void>::promise((promise<void> *)local_510);
      std::promise<void>::set_value((promise<void> *)local_510);
      iVar20 = pthread_mutex_lock(local_488);
      sVar19 = local_4f0;
      if (iVar20 != 0) {
        std::__throw_system_error(iVar20);
      }
      local_168._num_topologies = local_168._num_topologies - 1;
      if (local_168._num_topologies == 0) {
        std::condition_variable::notify_all();
      }
      pthread_mutex_unlock(local_488);
      std::__basic_future<void>::__basic_future
                ((__basic_future<void> *)&local_4e8,(__state_type *)local_510);
      local_538.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_4e8._M_ptr;
      local_538.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = local_4e8._M_refcount._M_pi;
      local_4e8._M_ptr = (element_type *)0x0;
      local_4e8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_528._0_16_ = (undefined1  [16])0x0;
      std::promise<void>::~promise((promise<void> *)local_510);
    }
    else {
      local_510._0_8_ = (element_type *)0x0;
      p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x88);
      p_Var13->_M_use_count = 1;
      p_Var13->_M_weak_count = 1;
      p_Var13->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00187cc8;
      p_Var13[1]._vptr__Sp_counted_base = (_func_int **)local_260;
      std::promise<void>::promise((promise<void> *)&p_Var13[1]._M_use_count);
      p_Var13[3]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var13[3]._M_use_count = 0;
      p_Var13[3]._M_weak_count = 0;
      p_Var13[4]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var13[4]._M_use_count = 0;
      p_Var13[4]._M_weak_count = 0;
      p_Var13[3]._vptr__Sp_counted_base = (_func_int **)0x2;
      *(code **)&p_Var13[4]._M_use_count =
           std::
           _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/core/executor.hpp:2003:8)>
           ::_M_invoke;
      p_Var13[4]._vptr__Sp_counted_base =
           (_func_int **)
           std::
           _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/core/executor.hpp:2003:8)>
           ::_M_manager;
      p_Var13[5]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var13[5]._M_use_count = 0;
      p_Var13[5]._M_weak_count = 0;
      p_Var13[6]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var13[6]._M_use_count = 0;
      p_Var13[6]._M_weak_count = 0;
      pp_Var16 = (_func_int **)operator_new(0x28);
      local_510._0_8_ = p_Var13 + 1;
      *pp_Var16 = (_func_int *)&local_4b8;
      pp_Var16[1] = (_func_int *)(local_4d8 + 0x18);
      pp_Var16[2] = (_func_int *)local_4a8;
      pp_Var16[3] = (_func_int *)&local_450;
      pp_Var16[4] = (_func_int *)&local_480;
      p_Var13[5]._vptr__Sp_counted_base = pp_Var16;
      *(code **)&p_Var13[6]._M_use_count =
           std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:357:33)>
           ::_M_invoke;
      p_Var13[6]._vptr__Sp_counted_base =
           (_func_int **)
           std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:357:33)>
           ::_M_manager;
      p_Var13[7]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var13[7]._M_use_count = 0;
      p_Var13[8]._vptr__Sp_counted_base = (_func_int **)0x0;
      local_510._8_8_ = p_Var13;
      std::__basic_future<void>::__basic_future
                ((__basic_future<void> *)&local_4e8,(__state_type *)&p_Var13[1]._M_use_count);
      sVar19 = local_4f0;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_510._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_510._8_8_ + 0xc) = *(_Atomic_word *)(local_510._8_8_ + 0xc) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_510._8_8_ + 0xc) = *(_Atomic_word *)(local_510._8_8_ + 0xc) + 1;
        }
      }
      local_538.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_4e8._M_ptr;
      local_538.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = local_4e8._M_refcount._M_pi;
      local_528._8_8_ = local_510._8_8_;
      local_528._0_8_ = local_510._0_8_;
      iVar20 = pthread_mutex_lock((pthread_mutex_t *)(local_260 + 8));
      if (iVar20 != 0) {
        std::__throw_system_error(iVar20);
      }
      std::deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>::
      push_back((deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>
                 *)(local_200 + 8),(value_type *)local_510);
      if (((long)(local_1e0._8_8_ - local_1f0._8_8_) >> 4) +
          ((long)(local_1d0._8_8_ - local_1c0._0_8_) >> 4) +
          ((((ulong)((long)local_1b0 - local_1d0._0_8_) >> 3) - 1) +
          (ulong)(local_1b0 == (_Map_pointer)0x0)) * 0x20 == 1) {
        tf::Executor::_set_up_topology
                  (&local_168,*(Worker **)(in_FS_OFFSET + -8),(Topology *)local_510._0_8_);
      }
      pthread_mutex_unlock((pthread_mutex_t *)(local_260 + 8));
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_510._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_510._8_8_);
      }
    }
    std::future<void>::get(&local_538);
    if ((__uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
         )local_528._8_8_ !=
        (__uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
         )0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        piVar3 = (int *)(local_528._8_8_ + 0xc);
        iVar20 = *piVar3;
        *piVar3 = *piVar3 + -1;
        UNLOCK();
      }
      else {
        iVar20 = *(int *)(local_528._8_8_ + 0xc);
        *(int *)(local_528._8_8_ + 0xc) = iVar20 + -1;
      }
      if (iVar20 == 1) {
        (**(code **)(*(long *)local_528._8_8_ + 0x18))();
      }
    }
    if (local_538.super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_538.super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_tf::DeferredPipeflow>,_std::allocator<std::pair<const_unsigned_long,_tf::DeferredPipeflow>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_tf::DeferredPipeflow>,_std::allocator<std::pair<const_unsigned_long,_tf::DeferredPipeflow>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)local_2b8);
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)local_2f0);
    std::
    _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::~_Deque_base((_Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    *)local_340);
    std::vector<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>::~vector(&local_358);
    if (local_370.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
        super__Vector_impl_data._M_start != (Task *)0x0) {
      operator_delete(local_370.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_370.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_370.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_388 != (undefined8 *)0x0) {
      operator_delete(local_388,(long)local_378 - (long)local_388);
    }
    std::
    vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ::~vector(&local_418);
    if ((void *)local_4a8._0_8_ != (void *)0x0) {
      operator_delete((void *)local_4a8._0_8_,local_498 - local_4a8._0_8_);
    }
    tf::Taskflow::~Taskflow((Taskflow *)local_260);
    local_4b0 = local_4b0 + 1;
    if ((_Manager_type)0x64 < local_4b0) {
      if (local_450.super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_450.
                        super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_450.
                              super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_450.
                              super__Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((void *)local_478._0_8_ != (void *)0x0) {
        operator_delete((void *)local_478._0_8_,local_468 - local_478._0_8_);
      }
      tf::Executor::~Executor(&local_168);
      return;
    }
  } while( true );
}

Assistant:

void pipeline_2P_SP(size_t L, unsigned w) {

  tf::Executor executor(w);

  const size_t maxN = 100;

  std::vector<int> source(maxN);
  std::iota(source.begin(), source.end(), 0);
  std::vector<std::array<int, 2>> mybuffer(L);

  for(size_t N = 0; N <= maxN; N++) {

    tf::Taskflow taskflow;

    size_t j1 = 0;
    std::atomic<size_t> j2 = 0;
    std::mutex mutex;
    std::vector<int> collection;
    size_t cnt = 1;

    tf::Pipeline pl(L,
      tf::Pipe{tf::PipeType::SERIAL, [N, &source, &j1, &mybuffer, L](auto& pf) mutable {
        if(j1 == N) {
          pf.stop();
          return;
        }
        REQUIRE(j1 == source[j1]);
        REQUIRE(pf.token() % L == pf.line());
        //*(pf.output()) = source[j1] + 1;
        mybuffer[pf.line()][pf.pipe()] = source[j1] + 1;
        j1++;
      }},

      tf::Pipe{tf::PipeType::PARALLEL,
      [N, &collection, &mutex, &j2, &mybuffer, L](auto& pf) mutable {
        REQUIRE(j2++ < N);
        {
          std::scoped_lock<std::mutex> lock(mutex);
          REQUIRE(pf.token() % L == pf.line());
          collection.push_back(mybuffer[pf.line()][pf.pipe() - 1]);
        }
      }}
    );

    auto pipeline = taskflow.composed_of(pl).name("module_of_pipeline");
    auto test = taskflow.emplace([&](){
      REQUIRE(j1 == N);
      REQUIRE(j2 == N);

      std::sort(collection.begin(), collection.end());
      for(size_t i = 0; i < N; i++) {
        REQUIRE(collection[i] == i + 1);
      }
      REQUIRE(pl.num_tokens() == cnt * N);
    }).name("test");

    pipeline.precede(test);

    executor.run_n(taskflow, 3, [&]() mutable {
      j1 = j2 = 0;
      collection.clear();
      for(size_t i = 0; i < mybuffer.size(); ++i){
        for(size_t j = 0; j < mybuffer[0].size(); ++j){
          mybuffer[i][j] = 0;
        }
      }
      cnt++;
    }).get();
  }
}